

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O2

size_t prediction_and_quantization_3d_with_border_prediction<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  size_t buffer_dim0_offset;
  float *__ptr;
  long lVar4;
  size_t buffer_dim1_offset;
  int size_z;
  ulong uVar5;
  int capacity_00;
  ulong uVar6;
  ulong uVar7;
  float *z_data_pos;
  float *data_pos;
  int size_y;
  float *buffer;
  ulong uVar8;
  int size_x;
  float fVar9;
  float *local_108;
  float *local_f0;
  uchar *local_d0;
  size_t local_b8;
  int *local_a8;
  int *type_pos;
  void *local_88;
  size_t local_80;
  float *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  double reg_precisions [4];
  
  local_a8 = reg_params_type;
  type_pos = type;
  local_88 = malloc(size->num_blocks * 0x10 + 0x10);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    *(undefined4 *)((long)local_88 + lVar4 * 4) = 0;
  }
  fVar9 = (float)(precision * 0.1 * 0.25);
  uVar2 = size->block_size;
  uVar8 = (ulong)uVar2;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    reg_precisions[lVar4] = (double)(fVar9 / (float)(int)uVar2);
  }
  local_108 = (float *)((long)local_88 + 0x10);
  reg_precisions[3] = (double)fVar9;
  buffer_dim1_offset = size->d3 + 1;
  buffer_dim0_offset = (size->d2 + 1) * buffer_dim1_offset;
  local_80 = buffer_dim0_offset * 4;
  __ptr = (float *)calloc(1,((long)(int)uVar2 + 1) * local_80);
  capacity_00 = capacity + -2;
  if (mean_info->use_mean == false) {
    capacity_00 = capacity;
  }
  local_b8 = 0;
  uVar6 = 0;
  local_d0 = indicator;
  do {
    if (size->num_x <= uVar6) {
      free(__ptr);
      free(local_88);
      return local_b8;
    }
    uVar1 = uVar6 + 1;
    uVar7 = 0;
    buffer = __ptr;
    local_f0 = data;
    local_78 = data;
    local_70 = uVar6;
    while (uVar7 < size->num_y) {
      uVar5 = 0;
      data_pos = local_f0;
      local_68 = uVar7;
      while( true ) {
        iVar3 = (int)uVar8;
        lVar4 = (long)iVar3;
        if (size->num_z <= uVar5) break;
        size_x = (int)size->d1 - (int)uVar6 * iVar3;
        if (uVar1 * lVar4 < size->d1) {
          size_x = iVar3;
        }
        size_y = (int)size->d2 - (int)local_68 * iVar3;
        if ((uVar7 + 1) * lVar4 < size->d2) {
          size_y = iVar3;
        }
        local_60 = uVar5 + 1;
        size_z = (int)size->d3 - (int)uVar5 * iVar3;
        if (lVar4 * local_60 < size->d3) {
          size_z = iVar3;
        }
        iVar3 = size_y;
        if (size_x < size_y) {
          iVar3 = size_x;
        }
        if (size_z <= iVar3) {
          iVar3 = size_z;
        }
        if (iVar3 < 4) {
          local_d0[uVar5] = '\0';
LAB_0010512a:
          block_pred_and_quant_lorenzo_3d<float>
                    (mean_info,data_pos,buffer,precision,capacity_00,intv_radius,size_x,size_y,
                     size_z,buffer_dim0_offset,buffer_dim1_offset,size->dim0_offset,
                     size->dim1_offset,&type_pos,unpredictable_data_pos);
        }
        else {
          compute_regression_coeffcients_3d<float>
                    (data_pos,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,local_108);
          iVar3 = sz_blockwise_selection_3d<float>
                            (data_pos,mean_info,size->dim0_offset,size->dim1_offset,iVar3,
                             (float)(precision * 1.22),local_108);
          local_d0[uVar5] = (uchar)iVar3;
          if ((uchar)iVar3 == '\0') goto LAB_0010512a;
          compress_regression_coefficient_3d
                    (reg_precisions,local_108,local_a8,reg_unpredictable_data_pos);
          block_pred_and_quant_regression_3d_with_buffer<float>
                    (data_pos,local_108,buffer,precision,capacity,intv_radius,size_x,size_y,size_z,
                     buffer_dim0_offset,buffer_dim1_offset,size->dim0_offset,size->dim1_offset,
                     &type_pos,unpredictable_data_pos);
          local_b8 = local_b8 + 1;
          local_108 = local_108 + 4;
          local_a8 = local_a8 + 4;
        }
        uVar8 = (ulong)size->block_size;
        buffer = buffer + uVar8;
        data_pos = data_pos + size_z;
        uVar5 = local_60;
        uVar6 = local_70;
      }
      local_f0 = local_f0 + size->dim1_offset * lVar4;
      buffer = buffer + (buffer_dim1_offset - size->num_z) * lVar4;
      local_d0 = local_d0 + uVar5;
      uVar7 = uVar7 + 1;
    }
    memcpy(__ptr,__ptr + buffer_dim0_offset * (long)(int)uVar8,local_80);
    data = local_78 + (long)(int)uVar8 * size->dim0_offset;
    uVar6 = uVar1;
  } while( true );
}

Assistant:

size_t
prediction_and_quantization_3d_with_border_prediction(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	// maintain a buffer of (block_size+1)*(r2+1)*(r3+1)
	size_t buffer_dim0_offset = (size.d2+1)*(size.d3+1);
	size_t buffer_dim1_offset = size.d3+1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*(size.d3+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d_with_buffer(z_data_pos, reg_params_pos, pred_buffer_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer_pos, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				pred_buffer_pos += size.block_size;
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
			pred_buffer_pos += size.block_size*buffer_dim1_offset - size.block_size*size.num_z;
		}
		// copy bottom of buffer to top of buffer
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}